

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O3

void __thiscall
ft::list<std::__cxx11::string,ft::allocator<std::__cxx11::string>>::
merge<ft::less<std::__cxx11::string>>
          (list<std::__cxx11::string,ft::allocator<std::__cxx11::string>> *this,
          list<std::__cxx11::string,ft::allocator<std::__cxx11::string>> *x)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  if ((this != x) && (*(long *)(x + 0x10) != 0)) {
    lVar5 = *(long *)(*(long *)this + 0x28);
    do {
      lVar4 = *(long *)x;
      if (lVar5 == *(long *)(this + 8)) {
LAB_001094a1:
        lVar4 = *(long *)(lVar4 + 0x28);
        if ((lVar5 == lVar4) || (lVar1 = *(long *)(lVar4 + 0x28), lVar5 == lVar1))
        goto LAB_001094e4;
        lVar2 = *(long *)(lVar4 + 0x20);
        *(long *)(lVar2 + 0x28) = lVar1;
        *(long *)(lVar1 + 0x20) = lVar2;
        lVar1 = *(long *)(lVar5 + 0x20);
        *(long *)(lVar1 + 0x28) = lVar4;
        *(long *)(lVar4 + 0x20) = lVar1;
        *(long *)(lVar5 + 0x20) = lVar4;
        *(long *)(lVar4 + 0x28) = lVar5;
        *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
        lVar4 = *(long *)(x + 0x10) + -1;
        *(long *)(x + 0x10) = lVar4;
      }
      else {
        iVar3 = std::__cxx11::string::compare(*(string **)(lVar4 + 0x28));
        if (iVar3 < 0) {
          lVar4 = *(long *)x;
          goto LAB_001094a1;
        }
        lVar5 = *(long *)(lVar5 + 0x28);
LAB_001094e4:
        lVar4 = *(long *)(x + 0x10);
      }
    } while (lVar4 != 0);
  }
  return;
}

Assistant:

void merge(list & x, Compare comp) {
		if (this != &x) {
			iterator	it = this->begin();
			while (!x.empty()) {
				if (it == this->end() || comp(*(x.begin()), *it)) this->splice(it, x, x.begin());
				else ++it;
			}
		}
	}